

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_utils.hpp
# Opt level: O0

unsigned_long
duckdb::alp::AlpUtils::FindFirstValueNotInPositionsArray<unsigned_long>
          (unsigned_long *input_vector,uint16_t *positions,idx_t values_count)

{
  idx_t i;
  unsigned_long a_non_special_value;
  idx_t values_count_local;
  uint16_t *positions_local;
  unsigned_long *input_vector_local;
  
  i = 0;
  while( true ) {
    if (values_count <= i) {
      return 0;
    }
    if (i != positions[i]) break;
    i = i + 1;
  }
  return input_vector[i];
}

Assistant:

static T FindFirstValueNotInPositionsArray(const T *input_vector, const uint16_t *positions, idx_t values_count) {
		T a_non_special_value = 0;
		for (idx_t i = 0; i < values_count; i++) {
			if (i != positions[i]) {
				a_non_special_value = input_vector[i];
				break;
			}
		}
		return a_non_special_value;
	}